

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O2

VecPtr * __thiscall SpeciesTracker::FindPolymers(SpeciesTracker *this,string *promoter_name)

{
  size_type sVar1;
  mapped_type *pmVar2;
  runtime_error *this_00;
  
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>_>_>_>
          ::count(&this->promoter_map_,promoter_name);
  if (sVar1 != 0) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>_>_>_>
             ::operator[](&this->promoter_map_,promoter_name);
    return pmVar2;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Species not found in tracker.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const Polymer::VecPtr &SpeciesTracker::FindPolymers(
    const std::string &promoter_name) {
  if (promoter_map_.count(promoter_name) == 0) {
    throw std::runtime_error("Species not found in tracker.");
  }
  return promoter_map_[promoter_name];
}